

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::printStatistics(Cache *this)

{
  while( true ) {
    puts("--------- STATISTICS -----------");
    printf("Num Read: %d\n",(ulong)(this->statistics).read_cnt);
    printf("Num Write: %d\n",(ulong)(this->statistics).write_cnt);
    printf("Num Hit: %d\n",(ulong)(this->statistics).hit_cnt);
    printf("Num Miss: %d\n",(ulong)(this->statistics).miss_cnt);
    printf("Total Cycles: %u\n",(ulong)(this->statistics).cycle_cnt);
    if (this->lower_cache == (Cache *)0x0) break;
    puts("----------- LOWER CACHE -----------");
    this = this->lower_cache;
  }
  return;
}

Assistant:

void Cache::printStatistics() {
    printf("--------- STATISTICS -----------\n");
    printf("Num Read: %d\n", this->statistics.read_cnt);
    printf("Num Write: %d\n", this->statistics.write_cnt);
    printf("Num Hit: %d\n", this->statistics.hit_cnt);
    printf("Num Miss: %d\n", this->statistics.miss_cnt);
    printf("Total Cycles: %u\n", this->statistics.cycle_cnt);
    if (this->lower_cache != nullptr) {
        printf("----------- LOWER CACHE -----------\n");
        this->lower_cache->printStatistics();
    }
}